

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O2

BOOL check_posix_syntax(PCRE2_SPTR8 ptr,PCRE2_SPTR8 ptrend,PCRE2_SPTR8 *endptr)

{
  PCRE2_SPTR8 pPVar1;
  PCRE2_UCHAR8 PVar2;
  PCRE2_SPTR8 pPVar3;
  PCRE2_SPTR8 pPVar4;
  
  pPVar3 = ptr;
LAB_0013e893:
  do {
    pPVar4 = pPVar3;
    pPVar1 = pPVar4 + 1;
    if ((long)ptrend - (long)pPVar1 < 2) {
      return 0;
    }
    PVar2 = *pPVar1;
    if (PVar2 == '[') {
      if (pPVar4[2] == *ptr) {
        return 0;
      }
    }
    else if (PVar2 == '\\') {
      pPVar3 = pPVar4 + 2;
      if ((pPVar4[2] & 0xfe) == 0x5c) goto LAB_0013e893;
    }
    else if (PVar2 == ']') {
      return 0;
    }
    pPVar3 = pPVar1;
    if ((PVar2 == *ptr) && (pPVar4[2] == ']')) {
      *endptr = pPVar1;
      return 1;
    }
  } while( true );
}

Assistant:

static BOOL
check_posix_syntax(PCRE2_SPTR ptr, PCRE2_SPTR ptrend, PCRE2_SPTR *endptr)
{
PCRE2_UCHAR terminator;  /* Don't combine these lines; the Solaris cc */
terminator = *ptr++;     /* compiler warns about "non-constant" initializer. */

for (; ptrend - ptr >= 2; ptr++)
  {
  if (*ptr == CHAR_BACKSLASH &&
      (ptr[1] == CHAR_RIGHT_SQUARE_BRACKET || ptr[1] == CHAR_BACKSLASH))
    ptr++;

  else if ((*ptr == CHAR_LEFT_SQUARE_BRACKET && ptr[1] == terminator) ||
            *ptr == CHAR_RIGHT_SQUARE_BRACKET) return FALSE;

  else if (*ptr == terminator && ptr[1] == CHAR_RIGHT_SQUARE_BRACKET)
    {
    *endptr = ptr;
    return TRUE;
    }
  }

return FALSE;
}